

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_plane.cpp
# Opt level: O2

void R_MapTiltedPlane(int y,int x1)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  int width;
  long lVar4;
  uint uVar5;
  BYTE **ppBVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  float fVar14;
  double dVar15;
  double dVar16;
  float fVar17;
  double dVar18;
  float fVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  fVar14 = (float)(centery - y);
  fVar19 = (float)(x1 - centerx);
  width = spanend[y] - x1;
  dVar24 = (double)(plane_sz.X * fVar19 + plane_sz.Y * fVar14 + plane_sz.Z);
  if (plane_shade) {
    R_CalcTiltedLighting
              ((double)planelightfloat * dVar24,
               ((double)(plane_sz.X * (float)width) + dVar24) * (double)planelightfloat,width);
    fVar14 = (float)(centery - y);
    fVar19 = (float)(x1 - centerx);
  }
  pBVar12 = dc_destorg + (x1 + ylookup[y]);
  bVar1 = 0x20 - (byte)ds_ybits;
  bVar2 = bVar1 - (byte)ds_xbits;
  uVar5 = ~(-1 << ((byte)ds_xbits & 0x1f)) << ((byte)ds_ybits & 0x1f);
  fVar17 = plane_sz.X * 16.0;
  dVar15 = (double)(fVar19 * plane_sv.X + plane_sv.Z + fVar14 * plane_sv.Y);
  dVar16 = (double)(fVar19 * plane_su.X + plane_su.Z + fVar14 * plane_su.Y);
  fVar14 = plane_sv.X * 16.0;
  fVar19 = plane_su.X * 16.0;
  lVar4 = 0;
  ppBVar6 = tiltlighting;
  iVar8 = 0x10;
  iVar3 = 0;
  pBVar13 = pBVar12;
  dVar18 = (1.0 / dVar24) * dVar15;
  dVar21 = dVar16 * (1.0 / dVar24);
  for (iVar10 = width + 1; 0xf < iVar10; iVar10 = iVar10 + -0x10) {
    dVar24 = dVar24 + (double)fVar17;
    dVar15 = dVar15 + (double)fVar14;
    dVar16 = dVar16 + (double)fVar19;
    dVar23 = dVar16 * (1.0 / dVar24);
    dVar22 = (1.0 / dVar24) * dVar15;
    uVar11 = (int)(long)dVar21 + pviewx;
    uVar7 = (int)(long)dVar18 + pviewy;
    iVar3 = iVar3 + 0x10;
    for (lVar9 = 0; iVar8 + lVar4 != lVar9; lVar9 = lVar9 + 1) {
      pBVar13[lVar9] =
           ppBVar6[lVar9][ds_source[uVar11 >> (bVar2 & 0x1f) & uVar5 | uVar7 >> (bVar1 & 0x1f)]];
      uVar11 = uVar11 + (int)(long)((dVar23 - dVar21) * 0.0625);
      uVar7 = uVar7 + (int)(long)((dVar22 - dVar18) * 0.0625);
    }
    ppBVar6 = ppBVar6 + 0x10;
    lVar4 = lVar4 + -0x10;
    iVar8 = iVar8 + 0x10;
    pBVar13 = pBVar13 + 0x10;
    dVar18 = dVar22;
    dVar21 = dVar23;
  }
  if (0 < iVar10) {
    if (iVar10 == 1) {
      pBVar12[iVar3] =
           tiltlighting[iVar3]
           [ds_source[(uint)(long)dVar21 >> (bVar2 & 0x1f) & uVar5 |
                      (uint)(long)dVar18 >> (bVar1 & 0x1f)]];
    }
    else {
      dVar22 = (double)iVar10;
      dVar23 = (double)plane_su.X;
      dVar20 = (double)plane_sv.X;
      dVar24 = 1.0 / ((double)plane_sz.X * dVar22 + dVar24);
      uVar11 = (int)(long)dVar21 + pviewx;
      uVar7 = (int)(long)dVar18 + pviewy;
      for (lVar4 = (long)iVar3; width + 1 != (int)lVar4; lVar4 = lVar4 + 1) {
        pBVar12[lVar4] =
             (*ppBVar6)[ds_source[uVar11 >> (bVar2 & 0x1f) & uVar5 | uVar7 >> (bVar1 & 0x1f)]];
        uVar11 = uVar11 + (int)(long)(((dVar16 + dVar23 * dVar22) * dVar24 - dVar21) *
                                     (1.0 / dVar22));
        uVar7 = uVar7 + (int)(long)((dVar24 * (dVar20 * dVar22 + dVar15) - dVar18) * (1.0 / dVar22))
        ;
        ppBVar6 = ppBVar6 + 1;
      }
    }
  }
  return;
}

Assistant:

void R_MapTiltedPlane (int y, int x1)
{
	int x2 = spanend[y];
	int width = x2 - x1;
	double iz, uz, vz;
	BYTE *fb;
	DWORD u, v;
	int i;

	iz = plane_sz[2] + plane_sz[1]*(centery-y) + plane_sz[0]*(x1-centerx);

	// Lighting is simple. It's just linear interpolation from start to end
	if (plane_shade)
	{
		uz = (iz + plane_sz[0]*width) * planelightfloat;
		vz = iz * planelightfloat;
		R_CalcTiltedLighting (vz, uz, width);
	}

	uz = plane_su[2] + plane_su[1]*(centery-y) + plane_su[0]*(x1-centerx);
	vz = plane_sv[2] + plane_sv[1]*(centery-y) + plane_sv[0]*(x1-centerx);

	fb = ylookup[y] + x1 + dc_destorg;

	BYTE vshift = 32 - ds_ybits;
	BYTE ushift = vshift - ds_xbits;
	int umask = ((1 << ds_xbits) - 1) << ds_ybits;

#if 0		// The "perfect" reference version of this routine. Pretty slow.
			// Use it only to see how things are supposed to look.
	i = 0;
	do
	{
		double z = 1.f/iz;

		u = SQWORD(uz*z) + pviewx;
		v = SQWORD(vz*z) + pviewy;
		ds_colormap = tiltlighting[i];
		fb[i++] = ds_colormap[ds_source[(v >> vshift) | ((u >> ushift) & umask)]];
		iz += plane_sz[0];
		uz += plane_su[0];
		vz += plane_sv[0];
	} while (--width >= 0);
#else
//#define SPANSIZE 32
//#define INVSPAN 0.03125f
//#define SPANSIZE 8
//#define INVSPAN 0.125f
#define SPANSIZE 16
#define INVSPAN	0.0625f

	double startz = 1.f/iz;
	double startu = uz*startz;
	double startv = vz*startz;
	double izstep, uzstep, vzstep;

	izstep = plane_sz[0] * SPANSIZE;
	uzstep = plane_su[0] * SPANSIZE;
	vzstep = plane_sv[0] * SPANSIZE;
	x1 = 0;
	width++;

	while (width >= SPANSIZE)
	{
		iz += izstep;
		uz += uzstep;
		vz += vzstep;

		double endz = 1.f/iz;
		double endu = uz*endz;
		double endv = vz*endz;
		DWORD stepu = SQWORD((endu - startu) * INVSPAN);
		DWORD stepv = SQWORD((endv - startv) * INVSPAN);
		u = SQWORD(startu) + pviewx;
		v = SQWORD(startv) + pviewy;

		for (i = SPANSIZE-1; i >= 0; i--)
		{
			fb[x1] = *(tiltlighting[x1] + ds_source[(v >> vshift) | ((u >> ushift) & umask)]);
			x1++;
			u += stepu;
			v += stepv;
		}
		startu = endu;
		startv = endv;
		width -= SPANSIZE;
	}
	if (width > 0)
	{
		if (width == 1)
		{
			u = SQWORD(startu);
			v = SQWORD(startv);
			fb[x1] = *(tiltlighting[x1] + ds_source[(v >> vshift) | ((u >> ushift) & umask)]);
		}
		else
		{
			double left = width;
			iz += plane_sz[0] * left;
			uz += plane_su[0] * left;
			vz += plane_sv[0] * left;

			double endz = 1.f/iz;
			double endu = uz*endz;
			double endv = vz*endz;
			left = 1.f/left;
			DWORD stepu = SQWORD((endu - startu) * left);
			DWORD stepv = SQWORD((endv - startv) * left);
			u = SQWORD(startu) + pviewx;
			v = SQWORD(startv) + pviewy;

			for (; width != 0; width--)
			{
				fb[x1] = *(tiltlighting[x1] + ds_source[(v >> vshift) | ((u >> ushift) & umask)]);
				x1++;
				u += stepu;
				v += stepv;
			}
		}
	}
#endif
}